

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::MergeFrom(FileOptions *this,FileOptions *from)

{
  bool bVar1;
  FileOptions_OptimizeMode value;
  LogMessage *other;
  string *psVar2;
  UnknownFieldSet *this_00;
  UnknownFieldSet *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  FileOptions *local_18;
  FileOptions *from_local;
  FileOptions *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x133d);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            (&this->uninterpreted_option_,&local_18->uninterpreted_option_);
  if ((local_18->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_java_package(local_18);
    if (bVar1) {
      psVar2 = java_package_abi_cxx11_(local_18);
      set_java_package(this,psVar2);
    }
    bVar1 = has_java_outer_classname(local_18);
    if (bVar1) {
      psVar2 = java_outer_classname_abi_cxx11_(local_18);
      set_java_outer_classname(this,psVar2);
    }
    bVar1 = has_java_multiple_files(local_18);
    if (bVar1) {
      bVar1 = java_multiple_files(local_18);
      set_java_multiple_files(this,bVar1);
    }
    bVar1 = has_java_generate_equals_and_hash(local_18);
    if (bVar1) {
      bVar1 = java_generate_equals_and_hash(local_18);
      set_java_generate_equals_and_hash(this,bVar1);
    }
    bVar1 = has_optimize_for(local_18);
    if (bVar1) {
      value = optimize_for(local_18);
      set_optimize_for(this,value);
    }
    bVar1 = has_go_package(local_18);
    if (bVar1) {
      psVar2 = go_package_abi_cxx11_(local_18);
      set_go_package(this,psVar2);
    }
    bVar1 = has_cc_generic_services(local_18);
    if (bVar1) {
      bVar1 = cc_generic_services(local_18);
      set_cc_generic_services(this,bVar1);
    }
    bVar1 = has_java_generic_services(local_18);
    if (bVar1) {
      bVar1 = java_generic_services(local_18);
      set_java_generic_services(this,bVar1);
    }
  }
  if (((local_18->_has_bits_[0] & 0xff00) != 0) &&
     (bVar1 = has_py_generic_services(local_18), bVar1)) {
    bVar1 = py_generic_services(local_18);
    set_py_generic_services(this,bVar1);
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&local_18->_extensions_);
  this_00 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_00,other_00);
  return;
}

Assistant:

void FileOptions::MergeFrom(const FileOptions& from) {
  GOOGLE_CHECK_NE(&from, this);
  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_java_package()) {
      set_java_package(from.java_package());
    }
    if (from.has_java_outer_classname()) {
      set_java_outer_classname(from.java_outer_classname());
    }
    if (from.has_java_multiple_files()) {
      set_java_multiple_files(from.java_multiple_files());
    }
    if (from.has_java_generate_equals_and_hash()) {
      set_java_generate_equals_and_hash(from.java_generate_equals_and_hash());
    }
    if (from.has_optimize_for()) {
      set_optimize_for(from.optimize_for());
    }
    if (from.has_go_package()) {
      set_go_package(from.go_package());
    }
    if (from.has_cc_generic_services()) {
      set_cc_generic_services(from.cc_generic_services());
    }
    if (from.has_java_generic_services()) {
      set_java_generic_services(from.java_generic_services());
    }
  }
  if (from._has_bits_[8 / 32] & (0xffu << (8 % 32))) {
    if (from.has_py_generic_services()) {
      set_py_generic_services(from.py_generic_services());
    }
  }
  _extensions_.MergeFrom(from._extensions_);
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}